

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineInterface.hpp
# Opt level: O3

void __thiscall supermap::cli::CommandLineInterface::Handler::~Handler(Handler *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_Handler = (_func_int **)&PTR___cxa_pure_virtual_00128a40;
  pcVar1 = (this->info_)._M_dataplus._M_p;
  paVar2 = &(this->info_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~Handler() = default;